

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEvaluatedTargetProperty.cxx
# Opt level: O0

EvaluatedTargetPropertyEntry *
EvaluateTargetPropertyEntry
          (EvaluatedTargetPropertyEntry *__return_storage_ptr__,cmGeneratorTarget *thisTarget,
          string *config,string *lang,cmGeneratorExpressionDAGChecker *dagChecker,
          TargetPropertyEntry *entry)

{
  cmLinkImplItem *item;
  string_view arg;
  TargetPropertyEntry *pTVar1;
  int iVar2;
  uint uVar3;
  cmLocalGenerator *pcVar4;
  undefined4 extraout_var;
  cmListFileBacktrace local_50;
  undefined1 local_39;
  TargetPropertyEntry *local_38;
  TargetPropertyEntry *entry_local;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  string *lang_local;
  string *config_local;
  cmGeneratorTarget *thisTarget_local;
  EvaluatedTargetPropertyEntry *ee;
  
  local_39 = 0;
  item = entry->LinkImplItem;
  local_38 = entry;
  entry_local = (TargetPropertyEntry *)dagChecker;
  dagChecker_local = (cmGeneratorExpressionDAGChecker *)lang;
  lang_local = config;
  config_local = (string *)thisTarget;
  thisTarget_local = (cmGeneratorTarget *)__return_storage_ptr__;
  (*entry->_vptr_TargetPropertyEntry[3])();
  EvaluatedTargetPropertyEntry::EvaluatedTargetPropertyEntry(__return_storage_ptr__,item,&local_50);
  cmListFileBacktrace::~cmListFileBacktrace(&local_50);
  pTVar1 = local_38;
  pcVar4 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)config_local);
  iVar2 = (*pTVar1->_vptr_TargetPropertyEntry[2])
                    (pTVar1,pcVar4,lang_local,config_local,entry_local,dagChecker_local);
  arg = (string_view)
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((string *)CONCAT44(extraout_var,iVar2));
  cmExpandList(arg,&__return_storage_ptr__->Values,No);
  uVar3 = (*local_38->_vptr_TargetPropertyEntry[5])();
  if ((uVar3 & 1) != 0) {
    __return_storage_ptr__->ContextDependent = true;
  }
  return __return_storage_ptr__;
}

Assistant:

EvaluatedTargetPropertyEntry EvaluateTargetPropertyEntry(
  cmGeneratorTarget const* thisTarget, std::string const& config,
  std::string const& lang, cmGeneratorExpressionDAGChecker* dagChecker,
  cmGeneratorTarget::TargetPropertyEntry& entry)
{
  EvaluatedTargetPropertyEntry ee(entry.LinkImplItem, entry.GetBacktrace());
  cmExpandList(entry.Evaluate(thisTarget->GetLocalGenerator(), config,
                              thisTarget, dagChecker, lang),
               ee.Values);
  if (entry.GetHadContextSensitiveCondition()) {
    ee.ContextDependent = true;
  }
  return ee;
}